

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O0

int __thiscall
lodepng::ExtractZlib::HuffmanTree::makeFromLengths
          (HuffmanTree *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *bitlen,
          unsigned_long maxbitlen)

{
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *p_Var1;
  const_reference pvVar2;
  reference pvVar3;
  ulong uVar4;
  value_type vVar5;
  ulong in_RDX;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  unsigned_long bit;
  unsigned_long i;
  unsigned_long n_1;
  unsigned_long n;
  unsigned_long bits_1;
  unsigned_long bits;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nextcode;
  vector<unsigned_long,_std::allocator<unsigned_long>_> blcount;
  vector<unsigned_long,_std::allocator<unsigned_long>_> tree1d;
  unsigned_long nodefilled;
  unsigned_long treepos;
  unsigned_long numcodes;
  allocator_type *in_stack_fffffffffffffe98;
  ulong uVar6;
  allocator_type *in_stack_fffffffffffffea0;
  size_type in_stack_fffffffffffffea8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffeb0;
  value_type in_stack_fffffffffffffeb8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffec0;
  ulong local_e8;
  ulong local_e0;
  size_type local_d0;
  size_type local_c8;
  ulong local_c0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_a8;
  undefined8 local_88;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_80 [2];
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_50;
  ulong local_38;
  ulong local_30;
  size_type local_28;
  ulong local_20;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_18;
  int local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_28 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RSI);
  local_30 = 0;
  local_38 = 0;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x149fb8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x149fde);
  local_88 = 0;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x14a00c);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
             (value_type_conflict2 *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x14a03a);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x14a068);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
             (value_type_conflict2 *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x14a096);
  for (local_c0 = 0; local_c0 < local_28; local_c0 = local_c0 + 1) {
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (local_18,local_c0);
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (local_80,*pvVar2);
    *pvVar3 = *pvVar3 + 1;
  }
  for (local_c8 = 1; local_c8 <= local_20; local_c8 = local_c8 + 1) {
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_a8,local_c8 - 1);
    in_stack_fffffffffffffec0 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)*pvVar3;
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (local_80,local_c8 - 1);
    vVar5 = *pvVar3;
    p_Var1 = &in_stack_fffffffffffffec0->
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>;
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_a8,local_c8);
    *pvVar3 = ((long)&(p_Var1->_M_impl).super__Vector_impl_data._M_start + vVar5) * 2;
  }
  for (local_d0 = 0; local_d0 < local_28; local_d0 = local_d0 + 1) {
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (local_18,local_d0);
    if (*pvVar2 != 0) {
      pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (local_18,local_d0);
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_a8,*pvVar2);
      in_stack_fffffffffffffeb8 = *pvVar3;
      *pvVar3 = in_stack_fffffffffffffeb8 + 1;
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_50,local_d0);
      *pvVar3 = in_stack_fffffffffffffeb8;
    }
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x14a2c7);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
             (value_type_conflict2 *)in_stack_fffffffffffffeb0);
  local_e0 = 0;
  do {
    if (local_28 <= local_e0) {
      local_4 = 0;
LAB_0014a576:
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffea0)
      ;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffea0)
      ;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffea0)
      ;
      return local_4;
    }
    local_e8 = 0;
    while (uVar4 = local_e8,
          pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (local_18,local_e0), uVar4 < *pvVar2) {
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_50,local_e0);
      vVar5 = *pvVar3;
      pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (local_18,local_e0);
      uVar4 = vVar5 >> (((char)*pvVar2 - (char)local_e8) - 1U & 0x3f) & 1;
      if (local_28 - 2 < local_30) {
        local_4 = 0x37;
        goto LAB_0014a576;
      }
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (in_RDI,local_30 * 2 + uVar4);
      if (*pvVar3 == 0x7fff) {
        in_stack_fffffffffffffea0 = (allocator_type *)(local_e8 + 1);
        pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (local_18,local_e0);
        if (in_stack_fffffffffffffea0 == (allocator_type *)*pvVar2) {
          uVar6 = local_e0;
          pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (in_RDI,local_30 * 2 + uVar4);
          *pvVar3 = uVar6;
          local_30 = 0;
        }
        else {
          local_38 = local_38 + 1;
          vVar5 = local_38 + local_28;
          pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (in_RDI,local_30 * 2 + uVar4);
          *pvVar3 = vVar5;
          local_30 = local_38;
        }
      }
      else {
        pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (in_RDI,local_30 * 2 + uVar4);
        local_30 = *pvVar3 - local_28;
      }
      local_e8 = local_e8 + 1;
    }
    local_e0 = local_e0 + 1;
  } while( true );
}

Assistant:

int makeFromLengths(const std::vector<unsigned long>& bitlen, unsigned long maxbitlen) { //make tree given the lengths
      unsigned long numcodes = (unsigned long)(bitlen.size()), treepos = 0, nodefilled = 0;
      std::vector<unsigned long> tree1d(numcodes), blcount(maxbitlen + 1, 0), nextcode(maxbitlen + 1, 0);
      //count number of instances of each code length
      for(unsigned long bits = 0; bits < numcodes; bits++) blcount[bitlen[bits]]++;
      for(unsigned long bits = 1; bits <= maxbitlen; bits++) {
        nextcode[bits] = (nextcode[bits - 1] + blcount[bits - 1]) << 1;
      }
      //generate all the codes
      for(unsigned long n = 0; n < numcodes; n++) if(bitlen[n] != 0) tree1d[n] = nextcode[bitlen[n]]++;
      tree2d.clear(); tree2d.resize(numcodes * 2, 32767); //32767 here means the tree2d isn't filled there yet
      for(unsigned long n = 0; n < numcodes; n++) //the codes
      for(unsigned long i = 0; i < bitlen[n]; i++) { //the bits for this code
        unsigned long bit = (tree1d[n] >> (bitlen[n] - i - 1)) & 1;
        if(treepos > numcodes - 2) return 55;
        if(tree2d[2 * treepos + bit] == 32767) { //not yet filled in
          if(i + 1 == bitlen[n]) {
            //last bit
            tree2d[2 * treepos + bit] = n;
            treepos = 0;
          } else {
            //addresses are encoded as values > numcodes
            tree2d[2 * treepos + bit] = ++nodefilled + numcodes;
            treepos = nodefilled;
          }
        }
        else treepos = tree2d[2 * treepos + bit] - numcodes; //subtract numcodes from address to get address value
      }
      return 0;
    }